

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_queue_impl_qwqr.cpp
# Opt level: O2

bool __thiscall
foxxll::file_offset_match::operator()(file_offset_match *this,request_ptr *a,request_ptr *b)

{
  offset_type oVar1;
  file *pfVar2;
  request *prVar3;
  bool bVar4;
  
  prVar3 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->(a);
  oVar1 = prVar3->offset_;
  prVar3 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->(b);
  if (oVar1 == prVar3->offset_) {
    prVar3 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->(a);
    pfVar2 = prVar3->file_;
    prVar3 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->(b);
    bVar4 = pfVar2 == prVar3->file_;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator () (
        const request_ptr& a,
        const request_ptr& b) const
    {
        // matching file and offset are enough to cause problems
        return (a->offset() == b->offset()) &&
               (a->get_file() == b->get_file());
    }